

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

wstring * __thiscall
mjs::token_string_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,token_type t)

{
  token_type t_00;
  wostringstream woss;
  wostringstream local_190 [112];
  ios_base local_120 [264];
  
  t_00 = (token_type)this;
  if (((0x21 < t_00 - false_) || ((0x200040001U >> ((ulong)(t_00 - false_) & 0x3f) & 1) == 0)) &&
     (1 < t_00 - numeric_literal)) {
    std::__cxx11::wostringstream::wostringstream(local_190);
    operator<<((wostream *)local_190,t_00);
    std::__cxx11::wstringbuf::str();
    std::__cxx11::wostringstream::~wostringstream(local_190);
    std::ios_base::~ios_base(local_120);
    return __return_storage_ptr__;
  }
  __assert_fail("!is_literal(t)",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp",
                0x27,"std::wstring mjs::token_string(token_type)");
}

Assistant:

std::wstring token_string(token_type t) {
    assert(!is_literal(t));
    std::wostringstream woss;
    woss << t;
    return woss.str();
}